

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O3

void __thiscall
brotli::BlockSplitter<brotli::Histogram<704>_>::FinishBlock
          (BlockSplitter<brotli::Histogram<704>_> *this,bool is_final)

{
  uint *puVar1;
  uint uVar2;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *pvVar3;
  size_t sVar4;
  BlockSplit *pBVar5;
  pointer puVar6;
  pointer puVar7;
  size_t sVar8;
  double dVar9;
  uint32_t *puVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  size_t i;
  long lVar14;
  pointer pHVar15;
  ulong uVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  uint *__s;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Histogram<704> combined_histo [2];
  double local_1678;
  double local_1670;
  double local_1668;
  double local_1660;
  uint local_1658 [706];
  undefined8 local_b50;
  uint local_b48 [706];
  undefined8 local_40;
  
  uVar16 = this->min_block_size_;
  uVar20 = this->block_size_;
  if (this->block_size_ < uVar16) {
    this->block_size_ = uVar16;
    uVar20 = uVar16;
  }
  if (this->num_blocks_ == 0) {
    pBVar5 = this->split_;
    *(pBVar5->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = (uint)uVar20;
    *(pBVar5->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = '\0';
    uVar16 = this->alphabet_size_;
    pHVar15 = (this->histograms_->
              super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    puVar10 = pHVar15->data_;
    dVar9 = 0.0;
    uVar20 = 0;
    if ((uVar16 & 1) != 0) goto LAB_00184a73;
    while (pHVar15 < (pointer)(puVar10 + uVar16)) {
      uVar13 = (ulong)pHVar15->data_[0];
      pHVar15 = (pointer)(pHVar15->data_ + 1);
      uVar20 = uVar20 + uVar13;
      if (uVar13 < 0x100) {
        dVar21 = (double)*(float *)(kLog2Table + uVar13 * 4);
      }
      else {
        dVar21 = log2((double)uVar13);
      }
      dVar9 = dVar9 - (double)uVar13 * dVar21;
LAB_00184a73:
      uVar13 = (ulong)pHVar15->data_[0];
      pHVar15 = (pointer)(pHVar15->data_ + 1);
      uVar20 = uVar20 + uVar13;
      if (uVar13 < 0x100) {
        dVar21 = (double)*(float *)(kLog2Table + uVar13 * 4);
      }
      else {
        dVar21 = log2((double)uVar13);
      }
      dVar9 = dVar9 - (double)uVar13 * dVar21;
    }
    auVar24._8_4_ = (int)(uVar20 >> 0x20);
    auVar24._0_8_ = uVar20;
    auVar24._12_4_ = 0x45300000;
    dVar21 = (auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
    if (uVar20 != 0) {
      if (uVar20 < 0x100) {
        dVar22 = (double)*(float *)(kLog2Table + uVar20 * 4);
      }
      else {
        dVar22 = log2(dVar21);
      }
      dVar9 = dVar9 + dVar22 * dVar21;
    }
    if (dVar21 <= dVar9) {
      dVar21 = dVar9;
    }
    this->last_entropy_[0] = dVar21;
    this->last_entropy_[1] = dVar21;
    this->num_blocks_ = this->num_blocks_ + 1;
    this->split_->num_types = this->split_->num_types + 1;
    this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
    this->block_size_ = 0;
  }
  else if (uVar20 != 0) {
    uVar16 = this->alphabet_size_;
    pHVar15 = (this->histograms_->
              super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
              _M_impl.super__Vector_impl_data._M_start + this->curr_histogram_ix_;
    puVar10 = pHVar15->data_;
    dVar9 = 0.0;
    uVar20 = 0;
    if ((uVar16 & 1) == 0) goto LAB_00184b69;
    while( true ) {
      uVar13 = (ulong)pHVar15->data_[0];
      pHVar15 = (pointer)(pHVar15->data_ + 1);
      uVar20 = uVar20 + uVar13;
      if (uVar13 < 0x100) {
        dVar21 = (double)*(float *)(kLog2Table + uVar13 * 4);
      }
      else {
        dVar21 = log2((double)uVar13);
      }
      dVar9 = dVar9 - (double)uVar13 * dVar21;
LAB_00184b69:
      if ((pointer)(puVar10 + uVar16) <= pHVar15) break;
      uVar13 = (ulong)pHVar15->data_[0];
      pHVar15 = (pointer)(pHVar15->data_ + 1);
      uVar20 = uVar20 + uVar13;
      if (uVar13 < 0x100) {
        dVar21 = (double)*(float *)(kLog2Table + uVar13 * 4);
      }
      else {
        dVar21 = log2((double)uVar13);
      }
      dVar9 = dVar9 - (double)uVar13 * dVar21;
    }
    auVar25._8_4_ = (int)(uVar20 >> 0x20);
    auVar25._0_8_ = uVar20;
    auVar25._12_4_ = 0x45300000;
    dVar21 = (auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
    if (uVar20 != 0) {
      if (uVar20 < 0x100) {
        dVar22 = (double)*(float *)(kLog2Table + uVar20 * 4);
      }
      else {
        dVar22 = log2(dVar21);
      }
      dVar9 = dVar9 + dVar22 * dVar21;
    }
    __s = local_1658;
    lVar19 = 0;
    memset(__s,0,0xb08);
    local_b50 = 0x7ff0000000000000;
    memset(local_b48,0,0xb08);
    local_40 = 0x7ff0000000000000;
    if (dVar21 <= dVar9) {
      dVar21 = dVar9;
    }
    pdVar17 = &local_1668;
    pdVar18 = &local_1678;
    bVar11 = true;
    do {
      bVar12 = bVar11;
      pvVar3 = this->histograms_;
      sVar4 = this->last_histogram_ix_[lVar19];
      memcpy(__s,(pvVar3->
                 super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + this->curr_histogram_ix_,0xb10);
      pHVar15 = (pvVar3->
                super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      *(size_t *)(__s + 0x2c0) = *(long *)(__s + 0x2c0) + pHVar15[sVar4].total_count_;
      lVar14 = 0;
      do {
        __s[lVar14] = __s[lVar14] + pHVar15[sVar4].data_[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x2c0);
      puVar1 = __s + this->alphabet_size_;
      dVar9 = 0.0;
      uVar16 = 0;
      if ((this->alphabet_size_ & 1) != 0) goto LAB_00184e0e;
      while (__s < puVar1) {
        uVar20 = (ulong)*__s;
        __s = __s + 1;
        uVar16 = uVar16 + uVar20;
        if (uVar20 < 0x100) {
          dVar22 = (double)*(float *)(kLog2Table + uVar20 * 4);
        }
        else {
          dVar22 = log2((double)uVar20);
        }
        dVar9 = dVar9 - (double)uVar20 * dVar22;
LAB_00184e0e:
        uVar20 = (ulong)*__s;
        __s = __s + 1;
        uVar16 = uVar16 + uVar20;
        if (uVar20 < 0x100) {
          dVar22 = (double)*(float *)(kLog2Table + uVar20 * 4);
        }
        else {
          dVar22 = log2((double)uVar20);
        }
        dVar9 = dVar9 - (double)uVar20 * dVar22;
      }
      auVar26._8_4_ = (int)(uVar16 >> 0x20);
      auVar26._0_8_ = uVar16;
      auVar26._12_4_ = 0x45300000;
      dVar22 = (auVar26._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
      if (uVar16 != 0) {
        if (uVar16 < 0x100) {
          dVar23 = (double)*(float *)(kLog2Table + uVar16 * 4);
        }
        else {
          dVar23 = log2(dVar22);
        }
        dVar9 = dVar9 + dVar23 * dVar22;
      }
      if (dVar22 <= dVar9) {
        dVar22 = dVar9;
      }
      *pdVar17 = dVar22;
      *pdVar18 = (dVar22 - dVar21) - this->last_entropy_[lVar19];
      lVar19 = 1;
      pdVar18 = &local_1670;
      pdVar17 = &local_1660;
      __s = local_b48;
      bVar11 = false;
    } while (bVar12);
    pBVar5 = this->split_;
    uVar16 = pBVar5->num_types;
    if (((0xff < uVar16) || (local_1678 <= this->split_threshold_)) ||
       (local_1670 <= this->split_threshold_)) {
      uVar2 = (uint)this->block_size_;
      sVar4 = this->num_blocks_;
      puVar6 = (pBVar5->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_1678 + -20.0 <= local_1670) {
        puVar6 = puVar6 + (sVar4 - 1);
        *puVar6 = *puVar6 + uVar2;
        memcpy((this->histograms_->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start + this->last_histogram_ix_[0],local_1658,
               0xb10);
        this->last_entropy_[0] = local_1668;
        if (this->split_->num_types == 1) {
          this->last_entropy_[1] = local_1668;
        }
        this->block_size_ = 0;
        pHVar15 = (this->histograms_->
                  super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        sVar4 = this->curr_histogram_ix_;
        memset(pHVar15 + sVar4,0,0xb08);
        pHVar15[sVar4].bit_cost_ = INFINITY;
        uVar16 = this->merge_last_count_ + 1;
        this->merge_last_count_ = uVar16;
        if (1 < uVar16) {
          this->target_block_size_ = this->target_block_size_ + this->min_block_size_;
        }
        goto LAB_001850e6;
      }
      puVar6[sVar4] = uVar2;
      puVar7 = (pBVar5->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar7[sVar4] = puVar7[sVar4 - 2];
      pvVar3 = this->histograms_;
      sVar4 = this->last_histogram_ix_[0];
      sVar8 = this->last_histogram_ix_[1];
      this->last_histogram_ix_[0] = sVar8;
      this->last_histogram_ix_[1] = sVar4;
      memcpy((pvVar3->
             super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
             _M_impl.super__Vector_impl_data._M_start + sVar8,local_b48,0xb10);
      this->last_entropy_[1] = this->last_entropy_[0];
      this->last_entropy_[0] = local_1660;
      this->num_blocks_ = this->num_blocks_ + 1;
      this->block_size_ = 0;
      pHVar15 = (this->histograms_->
                super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar4 = this->curr_histogram_ix_;
      memset(pHVar15 + sVar4,0,0xb08);
      pHVar15[sVar4].bit_cost_ = INFINITY;
      this->merge_last_count_ = 0;
    }
    else {
      sVar4 = this->num_blocks_;
      (pBVar5->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] = (uint)this->block_size_;
      (pBVar5->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] = (uchar)uVar16;
      pBVar5 = this->split_;
      this->last_histogram_ix_[1] = this->last_histogram_ix_[0];
      this->last_histogram_ix_[0] = (ulong)(byte)pBVar5->num_types;
      this->last_entropy_[1] = this->last_entropy_[0];
      this->last_entropy_[0] = dVar21;
      this->num_blocks_ = this->num_blocks_ + 1;
      pBVar5->num_types = pBVar5->num_types + 1;
      this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
      this->block_size_ = 0;
      this->merge_last_count_ = 0;
    }
    this->target_block_size_ = this->min_block_size_;
  }
LAB_001850e6:
  if (is_final) {
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
              (this->histograms_,this->split_->num_types);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->split_->types,this->num_blocks_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->split_->lengths,this->num_blocks_);
  }
  return;
}

Assistant:

void FinishBlock(bool is_final) {
    if (block_size_ < min_block_size_) {
      block_size_ = min_block_size_;
    }
    if (num_blocks_ == 0) {
      // Create first block.
      split_->lengths[0] = static_cast<uint32_t>(block_size_);
      split_->types[0] = 0;
      last_entropy_[0] =
          BitsEntropy(&(*histograms_)[0].data_[0], alphabet_size_);
      last_entropy_[1] = last_entropy_[0];
      ++num_blocks_;
      ++split_->num_types;
      ++curr_histogram_ix_;
      block_size_ = 0;
    } else if (block_size_ > 0) {
      double entropy = BitsEntropy(&(*histograms_)[curr_histogram_ix_].data_[0],
                                   alphabet_size_);
      HistogramType combined_histo[2];
      double combined_entropy[2];
      double diff[2];
      for (size_t j = 0; j < 2; ++j) {
        size_t last_histogram_ix = last_histogram_ix_[j];
        combined_histo[j] = (*histograms_)[curr_histogram_ix_];
        combined_histo[j].AddHistogram((*histograms_)[last_histogram_ix]);
        combined_entropy[j] = BitsEntropy(
            &combined_histo[j].data_[0], alphabet_size_);
        diff[j] = combined_entropy[j] - entropy - last_entropy_[j];
      }

      if (split_->num_types < kMaxBlockTypes &&
          diff[0] > split_threshold_ &&
          diff[1] > split_threshold_) {
        // Create new block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = static_cast<uint8_t>(split_->num_types);
        last_histogram_ix_[1] = last_histogram_ix_[0];
        last_histogram_ix_[0] = static_cast<uint8_t>(split_->num_types);
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = entropy;
        ++num_blocks_;
        ++split_->num_types;
        ++curr_histogram_ix_;
        block_size_ = 0;
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else if (diff[1] < diff[0] - 20.0) {
        // Combine this block with second last block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = split_->types[num_blocks_ - 2];
        std::swap(last_histogram_ix_[0], last_histogram_ix_[1]);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[1];
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = combined_entropy[1];
        ++num_blocks_;
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else {
        // Combine this block with last block.
        split_->lengths[num_blocks_ - 1] += static_cast<uint32_t>(block_size_);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[0];
        last_entropy_[0] = combined_entropy[0];
        if (split_->num_types == 1) {
          last_entropy_[1] = last_entropy_[0];
        }
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        if (++merge_last_count_ > 1) {
          target_block_size_ += min_block_size_;
        }
      }
    }
    if (is_final) {
      (*histograms_).resize(split_->num_types);
      split_->types.resize(num_blocks_);
      split_->lengths.resize(num_blocks_);
    }
  }